

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constants.cpp
# Opt level: O1

Pointer __thiscall
dg::pta::LLVMPointerGraphBuilder::handleConstantArithmetic
          (LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  PSNode *pPVar4;
  pointer ppPVar5;
  PSNodesSeq *pPVar6;
  byte bVar7;
  Instruction *pIVar8;
  long lVar9;
  Pointer PVar10;
  
  uVar1 = *(uint *)(Inst + 0x14);
  if ((uVar1 >> 0x1e & 1) == 0) {
    pIVar8 = Inst + -(ulong)(uVar1 << 5);
  }
  else {
    pIVar8 = *(Instruction **)(Inst + -8);
  }
  if (*(char *)(*(long *)pIVar8 + 0x10) == '\x10') {
    if ((uVar1 >> 0x1e & 1) == 0) {
      lVar9 = (long)Inst - (ulong)(uVar1 << 5);
    }
    else {
      lVar9 = *(long *)(Inst + -8);
    }
    pIVar8 = (Instruction *)(lVar9 + 0x20);
LAB_0011e438:
    pPVar4 = getOperand(this,*(Value **)pIVar8);
  }
  else {
    if ((uVar1 >> 0x1e & 1) == 0) {
      lVar9 = (long)Inst - (ulong)(uVar1 << 5);
    }
    else {
      lVar9 = *(long *)(Inst + -8);
    }
    if (*(char *)(*(long *)(lVar9 + 0x20) + 0x10) == '\x10') {
      if ((uVar1 >> 0x1e & 1) == 0) {
        pIVar8 = Inst + -(ulong)(uVar1 << 5);
      }
      else {
        pIVar8 = *(Instruction **)(Inst + -8);
      }
      goto LAB_0011e438;
    }
    if ((uVar1 >> 0x1e & 1) == 0) {
      pIVar8 = Inst + -(ulong)(uVar1 << 5);
    }
    else {
      pIVar8 = *(Instruction **)(Inst + -8);
    }
    pPVar4 = tryGetOperand(this,*(Value **)pIVar8);
    if (pPVar4 == (PSNode *)0x0) {
      if ((*(uint *)(Inst + 0x14) >> 0x1e & 1) == 0) {
        lVar9 = (long)Inst - (ulong)(*(uint *)(Inst + 0x14) << 5);
      }
      else {
        lVar9 = *(long *)(Inst + -8);
      }
      pPVar4 = tryGetOperand(this,*(Value **)(lVar9 + 0x20));
    }
    if (pPVar4 == (PSNode *)0x0) {
      pPVar6 = createUnknown(this,(Value *)Inst);
      ppPVar5 = (pPVar6->_nodes).
                super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      goto LAB_0011e495;
    }
  }
  p_Var2 = (pPVar4->pointsTo).pointers._bits.
           super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
           .
           super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ._M_h._M_before_begin._M_nxt;
  if (((pPVar4->pointsTo).pointers._bits.
       super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
       .
       super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ._M_h._M_element_count == 0) || (p_Var3 = p_Var2[2]._M_nxt, ((ulong)p_Var3 & 1) != 0)) {
    lVar9 = 0;
  }
  else {
    lVar9 = 0;
    do {
      if (lVar9 == 0x3f) {
        lVar9 = 0x40;
        break;
      }
      bVar7 = (byte)lVar9;
      lVar9 = lVar9 + 1;
    } while (((ulong)p_Var3 >> (bVar7 & 0x3f) & 2) == 0);
  }
  ppPVar5 = (pointer)((long)p_Var2[1]._M_nxt * 0x10 + lVar9 * 0x10 + _setEntry + -0x10);
LAB_0011e495:
  PVar10.offset.offset = Offset::UNKNOWN.offset;
  PVar10.target = *ppPVar5;
  return PVar10;
}

Assistant:

Pointer LLVMPointerGraphBuilder::handleConstantArithmetic(
        const llvm::Instruction *Inst) {
    using namespace llvm;

    PSNode *op;

    if (isa<ConstantInt>(Inst->getOperand(0))) {
        op = getOperand(Inst->getOperand(1));
    } else if (isa<ConstantInt>(Inst->getOperand(1))) {
        op = getOperand(Inst->getOperand(0));
    } else {
        op = tryGetOperand(Inst->getOperand(0));
        if (!op)
            op = tryGetOperand(Inst->getOperand(1));

        if (!op)
            return Pointer{createUnknown(Inst).getSingleNode(),
                           Offset::UNKNOWN};
    }

    assert(op && "Don't have operand for add");
    assert(op->pointsTo.size() == 1 &&
           "Constant add with not only one pointer");

    Pointer ptr = *op->pointsTo.begin();
    return {ptr.target, Offset::UNKNOWN};
}